

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_benchmark.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_6ab0::Benchmark::Test(Benchmark *this,string *filename)

{
  Util *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint64_t seed;
  pointer pcVar4;
  pointer pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  uint32_t uVar9;
  pointer pcVar10;
  istream *piVar11;
  long lVar12;
  ostream *poVar13;
  pointer pSVar14;
  long lVar15;
  size_t sVar16;
  size_t sVar17;
  int i;
  long lVar18;
  ulong uVar19;
  long lVar20;
  int iVar21;
  ulong uVar22;
  ulong uVar23;
  char *pcVar24;
  char *pcVar25;
  ulong uVar26;
  long lVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar30 [64];
  undefined1 in_ZMM3 [64];
  double dVar31;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  ulong local_530;
  size_t puzzle_guesses;
  pointer local_4f8;
  size_t local_4f0;
  char puzzle_output [81];
  vector<int,_std::allocator<int>_> perm;
  size_t local_478 [4];
  undefined8 local_458 [2];
  int aiStack_444 [3];
  ifstream file;
  int aiStack_434 [7];
  byte abStack_418 [4];
  uint auStack_414 [249];
  
  seed = (this->options_).random_seed;
  if (seed != 0) {
    Util::RandomSeed(&this->util,seed);
  }
  std::ifstream::ifstream((string *)&file);
  std::ifstream::open((string *)&file,(_Ios_Openmode)filename);
  if ((abStack_418[*(long *)(_file + -0x18)] & 5) != 0) {
LAB_001042fe:
    poVar13 = std::operator<<((ostream *)&std::cout,"Error opening ");
    poVar13 = std::operator<<(poVar13,(string *)filename);
    std::endl<char,std::char_traits<char>>(poVar13);
    exit(1);
  }
  this->allow_zero_ = false;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->dataset_,this->puzzle_buf_size_ * (this->options_).test_dataset_size);
  pcVar4 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar10 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start; pcVar10 != pcVar4; pcVar10 = pcVar10 + 1) {
    *pcVar10 = '\0';
  }
  puzzle_output._0_8_ = puzzle_output + 0x10;
  uVar8 = 0;
  uVar19 = 0;
  puzzle_output[8] = '\0';
  puzzle_output[9] = '\0';
  puzzle_output[10] = '\0';
  puzzle_output[0xb] = '\0';
  puzzle_output[0xc] = '\0';
  puzzle_output[0xd] = '\0';
  puzzle_output[0xe] = '\0';
  puzzle_output[0xf] = '\0';
  puzzle_output[0x10] = '\0';
  this_00 = &this->util;
  do {
LAB_00103aa0:
    piVar11 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&file,(string *)puzzle_output);
    if (((byte)piVar11[*(long *)(*(long *)piVar11 + -0x18) + 0x20] & 5) != 0) {
      std::ifstream::close();
      if ((uint)uVar19 == uVar8) {
        uVar22 = (ulong)(int)uVar8;
        uVar26 = uVar22;
        while (uVar19 = uVar26, uVar26 = uVar19 + uVar22,
              uVar26 < (this->options_).test_dataset_size) {
          pcVar10 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start;
          memcpy(pcVar10 + this->puzzle_buf_size_ * uVar19,pcVar10,this->puzzle_buf_size_ * uVar22);
          if ((this->options_).randomize == true) {
            for (uVar23 = 0; (~((int)uVar8 >> 0x1f) & uVar8) != uVar23; uVar23 = uVar23 + 1) {
              Util::PermuteSudoku(this_00,(this->dataset_).
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data._M_start +
                                          (uVar19 + uVar23) * this->puzzle_buf_size_,
                                  (this->options_).pencilmark);
            }
          }
        }
      }
      for (uVar26 = (ulong)(int)uVar19; uVar26 < (this->options_).test_dataset_size;
          uVar26 = uVar26 + 1) {
        uVar9 = Util::RandomUInt(this_00);
        pcVar10 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        strncpy(pcVar10 + this->puzzle_buf_size_ * uVar26,
                pcVar10 + this->puzzle_buf_size_ * ((ulong)uVar9 % (uVar19 & 0xffffffff)),
                this->puzzle_size_);
        if ((this->options_).randomize == true) {
          Util::PermuteSudoku(this_00,(this->dataset_).
                                      super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                      super__Vector_impl_data._M_start +
                                      this->puzzle_buf_size_ * uVar26,(this->options_).pencilmark);
        }
      }
      std::__cxx11::string::~string((string *)puzzle_output);
      std::ifstream::~ifstream(&file);
      if ((this->options_).csv_output == false) {
        poVar13 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        poVar13 = std::operator<<(poVar13,"|");
        lVar12 = *(long *)poVar13;
        lVar15 = *(long *)(lVar12 + -0x18);
        *(uint *)(poVar13 + lVar15 + 0x18) = *(uint *)(poVar13 + lVar15 + 0x18) & 0xffffff4f | 0x20;
        *(undefined8 *)(poVar13 + *(long *)(lVar12 + -0x18) + 0x10) = 0x25;
        poVar13 = std::operator<<(poVar13,(string *)filename);
        std::operator<<(poVar13," ");
        poVar13 = std::operator<<((ostream *)&std::cout,
                                  "|  puzzles/sec|  usec/puzzle|   %no_guess|  guesses/puzzle|");
        std::endl<char,std::char_traits<char>>(poVar13);
        poVar13 = std::operator<<((ostream *)&std::cout,
                                  "|--------------------------------------|------------:|------------:|-----------:|---------------:|"
                                 );
        std::endl<char,std::char_traits<char>>(poVar13);
      }
      Util::Permutation(&perm,this_00,(this->options_).test_dataset_size);
      local_4f8 = (this->options_).solvers.super__Vector_base<Solver,_std::allocator<Solver>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      pSVar14 = (this->options_).solvers.super__Vector_base<Solver,_std::allocator<Solver>_>._M_impl
                .super__Vector_impl_data._M_start;
      do {
        if (pSVar14 == local_4f8) {
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&perm.super__Vector_base<int,_std::allocator<int>_>);
          return;
        }
        puzzle_output[0x40] = '\0';
        puzzle_output[0x41] = '\0';
        puzzle_output[0x42] = '\0';
        puzzle_output[0x43] = '\0';
        puzzle_output[0x44] = '\0';
        puzzle_output[0x45] = '\0';
        puzzle_output[0x46] = '\0';
        puzzle_output[0x47] = '\0';
        puzzle_output[0x48] = '\0';
        puzzle_output[0x49] = '\0';
        puzzle_output[0x4a] = '\0';
        puzzle_output[0x4b] = '\0';
        puzzle_output[0x4c] = '\0';
        puzzle_output[0x4d] = '\0';
        puzzle_output[0x4e] = '\0';
        puzzle_output[0x4f] = '\0';
        puzzle_output[0x50] = '\0';
        puzzle_output[0] = '\0';
        puzzle_output[1] = '\0';
        puzzle_output[2] = '\0';
        puzzle_output[3] = '\0';
        puzzle_output[4] = '\0';
        puzzle_output[5] = '\0';
        puzzle_output[6] = '\0';
        puzzle_output[7] = '\0';
        puzzle_output[8] = '\0';
        puzzle_output[9] = '\0';
        puzzle_output[10] = '\0';
        puzzle_output[0xb] = '\0';
        puzzle_output[0xc] = '\0';
        puzzle_output[0xd] = '\0';
        puzzle_output[0xe] = '\0';
        puzzle_output[0xf] = '\0';
        puzzle_output[0x10] = '\0';
        puzzle_output[0x11] = '\0';
        puzzle_output[0x12] = '\0';
        puzzle_output[0x13] = '\0';
        puzzle_output[0x14] = '\0';
        puzzle_output[0x15] = '\0';
        puzzle_output[0x16] = '\0';
        puzzle_output[0x17] = '\0';
        puzzle_output[0x18] = '\0';
        puzzle_output[0x19] = '\0';
        puzzle_output[0x1a] = '\0';
        puzzle_output[0x1b] = '\0';
        puzzle_output[0x1c] = '\0';
        puzzle_output[0x1d] = '\0';
        puzzle_output[0x1e] = '\0';
        puzzle_output[0x1f] = '\0';
        puzzle_output[0x20] = '\0';
        puzzle_output[0x21] = '\0';
        puzzle_output[0x22] = '\0';
        puzzle_output[0x23] = '\0';
        puzzle_output[0x24] = '\0';
        puzzle_output[0x25] = '\0';
        puzzle_output[0x26] = '\0';
        puzzle_output[0x27] = '\0';
        puzzle_output[0x28] = '\0';
        puzzle_output[0x29] = '\0';
        puzzle_output[0x2a] = '\0';
        puzzle_output[0x2b] = '\0';
        puzzle_output[0x2c] = '\0';
        puzzle_output[0x2d] = '\0';
        puzzle_output[0x2e] = '\0';
        puzzle_output[0x2f] = '\0';
        puzzle_output[0x30] = '\0';
        puzzle_output[0x31] = '\0';
        puzzle_output[0x32] = '\0';
        puzzle_output[0x33] = '\0';
        puzzle_output[0x34] = '\0';
        puzzle_output[0x35] = '\0';
        puzzle_output[0x36] = '\0';
        puzzle_output[0x37] = '\0';
        puzzle_output[0x38] = '\0';
        puzzle_output[0x39] = '\0';
        puzzle_output[0x3a] = '\0';
        puzzle_output[0x3b] = '\0';
        puzzle_output[0x3c] = '\0';
        puzzle_output[0x3d] = '\0';
        puzzle_output[0x3e] = '\0';
        puzzle_output[0x3f] = '\0';
        auVar30 = ZEXT1664(in_ZMM2._0_16_);
        lVar15 = std::chrono::_V2::steady_clock::now();
        iVar21 = 0;
        lVar12 = lVar15 / 1000;
        while( true ) {
          auVar29 = auVar30._0_16_;
          lVar18 = (long)(this->options_).min_seconds_warmup;
          lVar12 = lVar12 - lVar15 / 1000;
          if (SBORROW8(lVar12,lVar18 * 1000000) == lVar12 + lVar18 * -1000000 < 0) break;
          sVar16 = this->puzzle_buf_size_;
          uVar9 = Util::RandomUInt(this_00);
          pcVar25 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start +
                    ((ulong)uVar9 % (this->options_).test_dataset_size) * sVar16;
          puzzle_output[0] = '.';
          sVar16 = (*pSVar14->solve_)(pcVar25,1,pSVar14->configuration_,puzzle_output,local_478);
          if (this->allow_zero_ == false) {
            if (sVar16 == 0) {
LAB_001042d7:
              ExitError(this,pcVar25,"warmup");
LAB_001042ec:
              ExitError(this,pcVar25,"benchmark");
              goto LAB_001042fe;
            }
            if (((this->options_).validate == true) && (pSVar14->returns_solution_ == true)) {
              pcVar24 = puzzle_output;
              auStack_414[7] = 0;
              auStack_414[8] = 0;
              auStack_414[9] = 0;
              auStack_414[10] = 0;
              auStack_414[0xb] = 0;
              auStack_414[0xc] = 0;
              auStack_414[0xd] = 0;
              auStack_414[0xe] = 0;
              auStack_414[0xf] = 0;
              auStack_414[0x10] = 0;
              auStack_414[0x11] = 0;
              _file = 0;
              _abStack_418 = 0;
              auStack_414[1] = 0;
              auStack_414[2] = 0;
              auStack_414[3] = 0;
              auStack_414[4] = 0;
              auStack_414[5] = 0;
              auStack_414[6] = 0;
              for (uVar19 = 0; uVar19 != 9; uVar19 = uVar19 + 1) {
                for (lVar12 = 0; lVar12 != 9; lVar12 = lVar12 + 1) {
                  uVar8 = 1 << ((byte)(pcVar24[lVar12] - 0x31) & 0x1f);
                  *(uint *)(&file + uVar19 * 4) = *(uint *)(&file + uVar19 * 4) ^ uVar8;
                  *(uint *)(abStack_418 + lVar12 * 4 + 4) =
                       *(uint *)(abStack_418 + lVar12 * 4 + 4) ^ uVar8;
                  *(uint *)(&file + (ulong)((uint)(byte)(((ushort)lVar12 & 0xff) / 3) +
                                           (((int)uVar19 + 0x12) - (int)((uVar19 & 0xffffffff) % 3))
                                           ) * 4) =
                       *(uint *)(&file + (ulong)((uint)(byte)(((ushort)lVar12 & 0xff) / 3) +
                                                (((int)uVar19 + 0x12) -
                                                (int)((uVar19 & 0xffffffff) % 3))) * 4) ^ uVar8;
                }
                pcVar24 = pcVar24 + 9;
              }
              for (lVar12 = 0xc; lVar12 != 0x6c; lVar12 = lVar12 + 0x10) {
                if (((*(int *)((long)aiStack_444 + lVar12) != 0x1ff) ||
                    (*(int *)((long)aiStack_444 + lVar12 + 4) != 0x1ff)) ||
                   (*(int *)((long)aiStack_444 + lVar12 + 8) != 0x1ff)) goto LAB_001042d7;
                if (*(int *)(&file + lVar12) != 0x1ff) {
                  if (lVar12 == 0x6c) goto LAB_00103f69;
                  goto LAB_001042d7;
                }
              }
              if (((auStack_414[0xf] != 0x1ff) || (auStack_414[0x10] != 0x1ff)) ||
                 (auStack_414[0x11] != 0x1ff)) goto LAB_001042d7;
            }
          }
LAB_00103f69:
          iVar21 = iVar21 + 1;
          auVar30 = ZEXT1664(auVar29);
          lVar12 = std::chrono::_V2::steady_clock::now();
          lVar12 = lVar12 / 1000;
        }
        iVar3 = (this->options_).min_seconds_test;
        auVar6._8_8_ = in_XMM6_Qb;
        auVar6._0_8_ = in_XMM6_Qa;
        auVar6 = vcvtusi2sd_avx512f(auVar6,(this->options_).test_dataset_size);
        puzzle_output[0x40] = '\0';
        puzzle_output[0x41] = '\0';
        puzzle_output[0x42] = '\0';
        puzzle_output[0x43] = '\0';
        puzzle_output[0x44] = '\0';
        puzzle_output[0x45] = '\0';
        puzzle_output[0x46] = '\0';
        puzzle_output[0x47] = '\0';
        puzzle_output[0x48] = '\0';
        puzzle_output[0x49] = '\0';
        puzzle_output[0x4a] = '\0';
        puzzle_output[0x4b] = '\0';
        puzzle_output[0x4c] = '\0';
        puzzle_output[0x4d] = '\0';
        puzzle_output[0x4e] = '\0';
        puzzle_output[0x4f] = '\0';
        puzzle_output[0x50] = '\0';
        puzzle_output[0] = '\0';
        puzzle_output[1] = '\0';
        puzzle_output[2] = '\0';
        puzzle_output[3] = '\0';
        puzzle_output[4] = '\0';
        puzzle_output[5] = '\0';
        puzzle_output[6] = '\0';
        puzzle_output[7] = '\0';
        puzzle_output[8] = '\0';
        puzzle_output[9] = '\0';
        puzzle_output[10] = '\0';
        puzzle_output[0xb] = '\0';
        puzzle_output[0xc] = '\0';
        puzzle_output[0xd] = '\0';
        puzzle_output[0xe] = '\0';
        puzzle_output[0xf] = '\0';
        puzzle_output[0x10] = '\0';
        puzzle_output[0x11] = '\0';
        puzzle_output[0x12] = '\0';
        puzzle_output[0x13] = '\0';
        puzzle_output[0x14] = '\0';
        puzzle_output[0x15] = '\0';
        puzzle_output[0x16] = '\0';
        puzzle_output[0x17] = '\0';
        puzzle_output[0x18] = '\0';
        puzzle_output[0x19] = '\0';
        puzzle_output[0x1a] = '\0';
        puzzle_output[0x1b] = '\0';
        puzzle_output[0x1c] = '\0';
        puzzle_output[0x1d] = '\0';
        puzzle_output[0x1e] = '\0';
        puzzle_output[0x1f] = '\0';
        puzzle_output[0x20] = '\0';
        puzzle_output[0x21] = '\0';
        puzzle_output[0x22] = '\0';
        puzzle_output[0x23] = '\0';
        puzzle_output[0x24] = '\0';
        puzzle_output[0x25] = '\0';
        puzzle_output[0x26] = '\0';
        puzzle_output[0x27] = '\0';
        puzzle_output[0x28] = '\0';
        puzzle_output[0x29] = '\0';
        puzzle_output[0x2a] = '\0';
        puzzle_output[0x2b] = '\0';
        puzzle_output[0x2c] = '\0';
        puzzle_output[0x2d] = '\0';
        puzzle_output[0x2e] = '\0';
        puzzle_output[0x2f] = '\0';
        puzzle_output[0x30] = '\0';
        puzzle_output[0x31] = '\0';
        puzzle_output[0x32] = '\0';
        puzzle_output[0x33] = '\0';
        puzzle_output[0x34] = '\0';
        puzzle_output[0x35] = '\0';
        puzzle_output[0x36] = '\0';
        puzzle_output[0x37] = '\0';
        puzzle_output[0x38] = '\0';
        puzzle_output[0x39] = '\0';
        puzzle_output[0x3a] = '\0';
        puzzle_output[0x3b] = '\0';
        puzzle_output[0x3c] = '\0';
        puzzle_output[0x3d] = '\0';
        puzzle_output[0x3e] = '\0';
        puzzle_output[0x3f] = '\0';
        auVar30 = ZEXT1664(auVar29);
        lVar15 = std::chrono::_V2::steady_clock::now();
        lVar15 = lVar15 / 1000;
        dVar28 = (double)iVar3 * (((double)iVar21 * 1000000.0) / (double)lVar12);
        if (dVar28 + dVar28 <= auVar6._0_8_) {
          local_530 = 0;
          lVar27 = 0;
          lVar18 = 0;
          lVar12 = lVar15;
          while( true ) {
            auVar29 = auVar30._0_16_;
            lVar20 = (long)(this->options_).min_seconds_test;
            lVar12 = lVar12 - lVar15;
            if (SBORROW8(lVar12,lVar20 * 2000000) == lVar12 + lVar20 * -2000000 < 0) break;
            pcVar25 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start +
                      (long)perm.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start
                            [local_530 % (this->options_).test_dataset_size] *
                      this->puzzle_buf_size_;
            sVar17 = (*pSVar14->solve_)(pcVar25,2 - (ulong)(this->options_).first_solution,
                                        pSVar14->configuration_,puzzle_output,&puzzle_guesses);
            sVar16 = puzzle_guesses;
            if ((sVar17 == 0) && (this->allow_zero_ == false)) goto LAB_001042ec;
            lVar12 = std::chrono::_V2::steady_clock::now();
            lVar12 = lVar12 / 1000;
            local_530 = local_530 + 1;
            lVar27 = lVar27 + (ulong)(sVar16 == 0);
            lVar18 = lVar18 + sVar16;
          }
        }
        else {
          local_530 = 0;
          lVar27 = 0;
          lVar18 = 0;
          lVar12 = lVar15;
          while( true ) {
            auVar29 = auVar30._0_16_;
            lVar20 = (long)(this->options_).min_seconds_test;
            lVar12 = lVar12 - lVar15;
            if (SBORROW8(lVar12,lVar20 * 1000000) == lVar12 + lVar20 * -1000000 < 0) break;
            for (uVar19 = 0; uVar26 = (this->options_).test_dataset_size, uVar19 < uVar26;
                uVar19 = uVar19 + 1) {
              pcVar25 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + this->puzzle_buf_size_ * uVar19;
              sVar16 = (*pSVar14->solve_)(pcVar25,2 - (ulong)(this->options_).first_solution,
                                          pSVar14->configuration_,puzzle_output,&puzzle_guesses);
              if ((sVar16 == 0) && (this->allow_zero_ == false)) {
                ExitError(this,pcVar25,"benchmark");
                goto LAB_001042d7;
              }
              lVar18 = lVar18 + puzzle_guesses;
              lVar27 = lVar27 + (ulong)(puzzle_guesses == 0);
            }
            lVar12 = std::chrono::_V2::steady_clock::now();
            lVar12 = lVar12 / 1000;
            local_530 = local_530 + uVar26;
          }
        }
        setlocale(1,"");
        bVar1 = (this->options_).csv_output;
        pcVar5 = (filename->_M_dataplus)._M_p;
        bVar2 = pSVar14->returns_guess_count_;
        std::__cxx11::string::string((string *)local_478,(string *)&pSVar14->name_);
        local_4f0 = local_478[0];
        std::__cxx11::string::string((string *)local_458,(string *)&pSVar14->desc_);
        pcVar25 = "%s,%s,%s,%s,%s%.0s,%f,%f,N/A,N/A";
        pcVar24 = "%.0s%.0s%.0s%.0s|%-27s%-11s|%\'12.1f |%\'12.1f |        N/A |            N/A |";
        if ((bVar2 & 1U) != 0) {
          pcVar25 = "%s,%s,%s,%s,%s%.0s,%f,%f,%f,%f";
          pcVar24 = "%.0s%.0s%.0s%.0s|%-27s%-11s|%\'12.1f |%\'12.1f |%10.1f%% |%\'15.2f |";
        }
        auVar6 = vcvtusi2sd_avx512f(auVar29,lVar18);
        auVar7 = vcvtusi2sd_avx512f(auVar29,local_530);
        if (bVar1 != false) {
          pcVar24 = pcVar25;
        }
        dVar31 = auVar7._0_8_;
        auVar7 = vcvtusi2sd_avx512f(auVar29,lVar27 * 100);
        auVar29 = vcvtusi2sd_avx512f(auVar29,local_530 * 1000000);
        dVar28 = auVar7._0_8_ / dVar31;
        in_ZMM2 = ZEXT1664(CONCAT88(auVar7._8_8_,dVar28));
        snprintf((char *)&file,0x400,pcVar24,auVar29._0_8_ / (double)lVar12,(double)lVar12 / dVar31,
                 dVar28,auVar6._0_8_ / dVar31,"Clang","19.1.5","-O2 -O3  -march=native",pcVar5,
                 local_4f0,local_458[0]);
        std::__cxx11::string::~string((string *)local_458);
        std::__cxx11::string::~string((string *)local_478);
        poVar13 = std::operator<<((ostream *)&std::cout,(char *)&file);
        std::endl<char,std::char_traits<char>>(poVar13);
        pSVar14 = pSVar14 + 1;
      } while( true );
    }
    if ((puzzle_output._8_8_ == 0) || (*(char *)puzzle_output._0_8_ == '#')) {
      lVar12 = std::__cxx11::string::find(puzzle_output,0x10a406);
      if (lVar12 != -1) {
        this->allow_zero_ = true;
      }
      goto LAB_00103aa0;
    }
    if (*(char *)(puzzle_output._0_8_ + -1 + puzzle_output._8_8_) == '\r') {
      std::__cxx11::string::erase((ulong)puzzle_output,puzzle_output._8_8_ - 1);
    }
    if ((ulong)puzzle_output._8_8_ < this->puzzle_size_) goto LAB_00103aa0;
    uVar8 = uVar8 + 1;
    if ((this->options_).test_dataset_size <= uVar19) {
      dVar28 = Util::RandomDouble(this_00);
      auVar29 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,(this->options_).test_dataset_size);
      in_ZMM2 = ZEXT1664(CONCAT88(in_ZMM3._8_8_,(double)(int)uVar8));
      if (dVar28 < auVar29._0_8_ / (double)(int)uVar8) {
        uVar9 = Util::RandomUInt(this_00);
        pcVar25 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start +
                  ((ulong)uVar9 % (this->options_).test_dataset_size) * this->puzzle_buf_size_;
        strncpy(pcVar25,(char *)puzzle_output._0_8_,this->puzzle_size_);
        if ((this->options_).randomize == true) {
          Util::PermuteSudoku(this_00,pcVar25,(this->options_).pencilmark);
        }
      }
      goto LAB_00103aa0;
    }
    pcVar25 = (this->dataset_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start + uVar19 * this->puzzle_buf_size_;
    strncpy(pcVar25,(char *)puzzle_output._0_8_,this->puzzle_size_);
    if ((this->options_).randomize == true) {
      Util::PermuteSudoku(this_00,pcVar25,(this->options_).pencilmark);
    }
    uVar19 = (ulong)((uint)uVar19 + 1);
  } while( true );
}

Assistant:

void Test(const string &filename) {
        if (options_.random_seed > 0) {
            util.RandomSeed(options_.random_seed);
        }
        Load(filename);
        OutputHeader(filename);

        // for the slow solvers we'll solve puzzles in this order to avoid any difficulty biases.
        auto perm = util.Permutation(options_.test_dataset_size);

        for (const Solver &solver : options_.solvers) {
            double puzzles_per_second = WarmupAndEstimateRate(solver);
            // we'll use the procedure for fast solvers if we expect to complete a full pass through
            // the data set in less than twice the min test time (or really less than up to 4x the min
            // test time since warmup is run with a limit of 1).
            bool fast = puzzles_per_second * options_.min_seconds_test * 2 > options_.test_dataset_size;

            char puzzle_output[81]{0};
            size_t puzzle_guesses;
            size_t total_guesses = 0;
            size_t total_no_guess = 0;
            size_t total_solved = 0;

            microseconds start = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
            microseconds end = start;

            if (fast) {
                while ((end - start).count() < options_.min_seconds_test * 1000000) {
                    for (int i = 0; i < options_.test_dataset_size; i++) {
                        const char *puzzle = &dataset_[puzzle_buf_size_ * i];
                        size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                        puzzle_output, &puzzle_guesses);
                        if (!allow_zero_ && !solutions) {
                            ExitError(puzzle, "benchmark");
                        }
                        total_guesses += puzzle_guesses;
                        total_no_guess += (puzzle_guesses == 0);
                    }
                    total_solved += options_.test_dataset_size;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            } else {
                while ((end - start).count() < options_.min_seconds_test * 2000000) {
                    const char *puzzle = &dataset_[puzzle_buf_size_ * perm[total_solved % options_.test_dataset_size]];
                    size_t solutions = solver.Solve(puzzle, options_.first_solution ? 1 : 2,
                                                    puzzle_output, &puzzle_guesses);
                    if (!allow_zero_ && !solutions) {
                        ExitError(puzzle, "benchmark");
                    }
                    total_guesses += puzzle_guesses;
                    total_no_guess += (puzzle_guesses == 0);
                    total_solved += 1;
                    end = duration_cast<microseconds>(steady_clock::now().time_since_epoch());
                }
            }

            auto total_usec = (end - start).count();
            OutputResult(solver, filename, total_solved, total_usec, total_guesses, total_no_guess);
        }
    }